

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.h
# Opt level: O0

void __thiscall bloaty::RollupOutput::RollupOutput(RollupOutput *this)

{
  RollupRow *in_RDI;
  string *in_stack_ffffffffffffff98;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x16d3b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  RollupRow::RollupRow(in_RDI,in_stack_ffffffffffffff98);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  std::__cxx11::string::string((string *)(in_RDI[1].name.field_2._M_local_buf + 8));
  *(undefined1 *)&in_RDI[1].filtered_size.file = 0;
  return;
}

Assistant:

RollupOutput() : toplevel_row_("TOTAL") {}